

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerExtendSInt64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  Builder *this_00;
  UnaryOp op;
  Index IVar2;
  Index index;
  Unary *value;
  LocalSet *any;
  LocalGet *pLVar3;
  Const *right;
  Binary *value_00;
  LocalSet *append;
  Block *e;
  TempVar local_98;
  undefined1 local_78 [8];
  TempVar highBits;
  TempVar lowBits;
  
  getTemp((TempVar *)local_78,this,(Type)0x2);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  fetchOutParam(&local_98,this,curr->value);
  TempVar::~TempVar(&local_98);
  value = (Unary *)curr->value;
  if (curr->op == ExtendS8Int64) {
    op = ExtendS8Int32;
  }
  else {
    if (curr->op != ExtendS16Int64) goto LAB_00a38a3d;
    op = ExtendS16Int32;
  }
  value = Builder::makeUnary((this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,op,
                             (Expression *)value);
LAB_00a38a3d:
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
  any = Builder::makeLocalSet(pBVar1,IVar2,(Expression *)value);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_78);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
  pLVar3 = Builder::makeLocalGet(this_00,index,(Type)0x2);
  right = Builder::makeConst<int>
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
  value_00 = Builder::makeBinary(this_00,ShrSInt32,(Expression *)pLVar3,(Expression *)right);
  append = Builder::makeLocalSet(pBVar1,IVar2,(Expression *)value_00);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
  pLVar3 = Builder::makeLocalGet(pBVar1,IVar2,(Type)0x2);
  e = Builder::blockify<wasm::LocalGet*>(pBVar1,(Expression *)any,(Expression *)append,pLVar3);
  setOutParam(this,(Expression *)e,(TempVar *)local_78);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)e);
  TempVar::~TempVar((TempVar *)&highBits.ty);
  TempVar::~TempVar((TempVar *)local_78);
  return;
}

Assistant:

void lowerExtendSInt64(Unary* curr) {
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();

    // free the temp var
    fetchOutParam(curr->value);

    Expression* lowValue = curr->value;
    switch (curr->op) {
      case ExtendS8Int64:
        lowValue = builder->makeUnary(ExtendS8Int32, lowValue);
        break;
      case ExtendS16Int64:
        lowValue = builder->makeUnary(ExtendS16Int32, lowValue);
        break;
      default:
        break;
    }

    LocalSet* setLow = builder->makeLocalSet(lowBits, lowValue);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(lowBits, Type::i32),
                          builder->makeConst(int32_t(31))));

    Block* result = builder->blockify(
      setLow, setHigh, builder->makeLocalGet(lowBits, Type::i32));

    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }